

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtils.h
# Opt level: O2

float ai_strtof(char *begin,char *end)

{
  double dVar1;
  string token;
  char *local_28 [2];
  char local_18 [16];
  
  if (begin != (char *)0x0) {
    if (end == (char *)0x0) {
      dVar1 = atof(begin);
    }
    else {
      local_28[0] = local_18;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_28);
      dVar1 = atof(local_28[0]);
      std::__cxx11::string::~string((string *)local_28);
    }
    return (float)dVar1;
  }
  return 0.0;
}

Assistant:

AI_FORCE_INLINE
float ai_strtof( const char *begin, const char *end ) {
    if ( nullptr == begin ) {
        return 0.0f;
    }
    float val( 0.0f );
    if ( nullptr == end ) {
        val = static_cast< float >( ::atof( begin ) );
    } else {
        std::string::size_type len( end - begin );
        std::string token( begin, len );
        val = static_cast< float >( ::atof( token.c_str() ) );
    }

    return val;
}